

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnSelect
          (SharedValidator *this,Location *loc,Index result_count,Type *result_types)

{
  TypeVector local_50;
  Enum local_38;
  Enum local_34;
  Type *local_30;
  Type *result_types_local;
  Location *pLStack_20;
  Index result_count_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_30 = result_types;
  result_types_local._4_4_ = result_count;
  pLStack_20 = loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = pLStack_20;
  if (result_types_local._4_4_ < 2) {
    ToTypeVector(&local_50,this,result_types_local._4_4_,local_30);
    local_38 = (Enum)TypeChecker::OnSelect(&this->typechecker_,&local_50);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_38);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_50);
  }
  else {
    local_34 = (Enum)PrintError(this,pLStack_20,"invalid arity in select instruction: %u.",
                                (ulong)result_types_local._4_4_);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnSelect(const Location& loc,
                                 Index result_count,
                                 Type* result_types) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  if (result_count > 1) {
    result |=
        PrintError(loc, "invalid arity in select instruction: %" PRIindex ".",
                   result_count);
  } else {
    result |= typechecker_.OnSelect(ToTypeVector(result_count, result_types));
  }
  return result;
}